

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_write_val_anchor(Parser *this,size_t node_id)

{
  Location loc;
  csubstr anchor;
  csubstr ref;
  bool bVar1;
  error_flags eVar2;
  csubstr *pcVar3;
  undefined8 in_RSI;
  Tree *in_RDI;
  csubstr r;
  size_t in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  Location *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  Tree *this_00;
  uint7 in_stack_ffffffffffffff10;
  undefined1 uVar4;
  Tree *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  Tree *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  Location *in_stack_ffffffffffffff40;
  char *local_b8;
  basic_substring<const_char> local_b0;
  size_t local_a0;
  char *local_98;
  undefined8 local_90;
  size_t *local_80;
  char *local_78;
  undefined4 local_70;
  undefined8 local_68;
  basic_substring<const_char> *local_60;
  undefined8 local_48;
  size_t local_40;
  undefined8 local_38;
  size_t local_30;
  undefined8 local_28;
  size_t local_20;
  NodeData *local_18;
  NodeData *local_10;
  NodeData *local_8;
  
  this_00 = (Tree *)&in_RDI[10].m_tag_directives[0].handle.len;
  uVar4 = true;
  if (in_RDI[10].m_tag_directives[0].prefix.str != (char *)0x0) {
    uVar4 = *(size_t *)this_00 == 0;
  }
  local_90 = in_RSI;
  local_80 = (size_t *)this_00;
  if ((bool)uVar4 == false) {
    local_a0 = in_RDI[10].m_tag_directives[0].handle.len;
    local_98 = in_RDI[10].m_tag_directives[0].prefix.str;
    anchor.len = in_stack_ffffffffffffff28;
    anchor.str = in_stack_ffffffffffffff20;
    Tree::set_val_anchor(in_stack_ffffffffffffff18,(ulong)in_stack_ffffffffffffff10,anchor);
    basic_substring<const_char>::clear
              ((basic_substring<const_char> *)&in_RDI[10].m_tag_directives[0].handle.len);
  }
  local_40 = (in_RDI->m_arena).len;
  local_48 = local_90;
  local_10 = Tree::_p(in_RDI,CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  if (((local_10->m_type).type & VAL) == NOTYPE) {
    basic_substring<char_const>::basic_substring<1ul>
              ((basic_substring<char_const> *)&local_b0,(char (*) [1])0x361d1e);
  }
  else {
    pcVar3 = Tree::val(this_00,(size_t)in_RDI);
    local_b0.str = pcVar3->str;
    local_b0.len = pcVar3->len;
  }
  local_20 = (in_RDI->m_arena).len;
  local_28 = local_90;
  local_18 = Tree::_p(in_RDI,CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  if ((((local_18->m_type).type & (VALQUO|VAL)) != (VALQUO|VAL)) &&
     (bVar1 = basic_substring<const_char>::begins_with(&local_b0,'*'), bVar1)) {
    local_30 = (in_RDI->m_arena).len;
    local_38 = local_90;
    local_8 = Tree::_p(in_RDI,CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    bVar1 = false;
    if (((local_8->m_type).type & VALANCH) != NOTYPE) {
      bVar1 = ((local_8->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
    }
    if (bVar1) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      Location::Location(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                         in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      in_stack_fffffffffffffec0 = in_stack_ffffffffffffff40;
      loc.super_LineCol.offset._7_1_ = uVar4;
      loc.super_LineCol.offset._0_7_ = in_stack_ffffffffffffff10;
      loc.super_LineCol.line = (size_t)in_stack_ffffffffffffff18;
      loc.super_LineCol.col = (size_t)in_stack_ffffffffffffff20;
      loc.name.str = (char *)in_stack_ffffffffffffff28;
      loc.name.len = (size_t)in_stack_ffffffffffffff30;
      in_stack_ffffffffffffff40 = in_stack_fffffffffffffec0;
      error<47ul>((char (*) [47])in_RDI,loc);
      in_stack_fffffffffffffec8 = local_b8;
    }
    local_60 = &local_b0;
    local_68 = 1;
    if (local_b0.len == 0) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) &&
         (in_stack_fffffffffffffed7 = is_debugger_attached(), (bool)in_stack_fffffffffffffed7)) {
        trap_instruction();
      }
      local_78 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_70 = 0x1533;
      handle_error(0x34dd90,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)
               CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,(size_t)in_stack_fffffffffffffec0);
    ref.len = (size_t)in_stack_ffffffffffffff40;
    ref.str = in_stack_ffffffffffffff38;
    Tree::set_val_ref(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,ref);
  }
  return;
}

Assistant:

void Parser::_write_val_anchor(size_t node_id)
{
    if( ! m_val_anchor.empty())
    {
        _c4dbgpf("node={}: set val anchor to '{}'", node_id, m_val_anchor);
        m_tree->set_val_anchor(node_id, m_val_anchor);
        m_val_anchor.clear();
    }
    csubstr r = m_tree->has_val(node_id) ? m_tree->val(node_id) : "";
    if(!m_tree->is_val_quoted(node_id) && r.begins_with('*'))
    {
        _c4dbgpf("node={}: set val reference: '{}'", node_id, r);
        RYML_CHECK(!m_tree->has_val_anchor(node_id));
        m_tree->set_val_ref(node_id, r.sub(1));
    }
}